

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O1

void __thiscall
booster::intrusive_ptr<booster::details::key>::~intrusive_ptr
          (intrusive_ptr<booster::details::key> *this)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = *(long **)this;
  if (plVar1 != (long *)0x0) {
    lVar2 = booster::atomic_counter::dec();
    if (lVar2 == 0) {
      (**(code **)(*plVar1 + 8))(plVar1);
      return;
    }
  }
  return;
}

Assistant:

~intrusive_ptr()
    {
        if(p_ != 0) intrusive_ptr_release(p_);
    }